

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::deinit(TextureGatherCase *this)

{
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data_01;
  MovePtr *pMVar1;
  ShaderProgram *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *__return_storage_ptr__;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_> local_91;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  local_90;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *local_80;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> local_69;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_68;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_58;
  DefaultDeleter<glu::ShaderProgram> local_31;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_30;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_20;
  TextureGatherCase *local_10;
  TextureGatherCase *this_local;
  
  local_10 = this;
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_31);
  pMVar1 = (MovePtr *)0x0;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr();
  local_20 = de::details::MovePtr::operator_cast_to_PtrData(&local_30,pMVar1);
  data._8_8_ = in_stack_ffffffffffffff40;
  data.ptr = in_stack_ffffffffffffff38;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_program,data);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_30);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter(&local_69);
  pMVar1 = (MovePtr *)0x0;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::MovePtr();
  local_58 = de::details::MovePtr::operator_cast_to_PtrData(&local_68,pMVar1);
  data_00._8_8_ = in_stack_ffffffffffffff40;
  data_00.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)in_stack_ffffffffffffff38;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::operator=(&this->m_fbo,data_00);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
              *)&local_68);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>::DefaultDeleter(&local_91);
  pMVar1 = (MovePtr *)0x0;
  __return_storage_ptr__ = &local_90;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::MovePtr();
  local_80 = de::details::MovePtr::operator_cast_to_PtrData(__return_storage_ptr__,pMVar1);
  data_01._8_8_ = __return_storage_ptr__;
  data_01.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)in_stack_ffffffffffffff38;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::operator=(&this->m_colorBuffer,data_01);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
              *)&local_90);
  return;
}

Assistant:

void TextureGatherCase::deinit (void)
{
	m_program		= MovePtr<ShaderProgram>(DE_NULL);
	m_fbo			= MovePtr<glu::Framebuffer>(DE_NULL);
	m_colorBuffer	= MovePtr<glu::Renderbuffer>(DE_NULL);
}